

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleTypeHandler<1UL>::MarshalAllPropertiesToScriptContext
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,ScriptContext *targetScriptContext,
          bool invalidateFixedFields)

{
  Var pvVar1;
  int local_28;
  int propertyIndex;
  bool invalidateFixedFields_local;
  ScriptContext *targetScriptContext_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  for (local_28 = 0; local_28 < this->propertyCount; local_28 = local_28 + 1) {
    pvVar1 = DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,local_28);
    pvVar1 = CrossSite::MarshalVar(targetScriptContext,pvVar1,false);
    DynamicTypeHandler::SetSlotUnchecked(instance,local_28,pvVar1);
  }
  return;
}

Assistant:

void SimpleTypeHandler<size>::MarshalAllPropertiesToScriptContext(DynamicObject* instance, ScriptContext* targetScriptContext, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.

        // We can ignore invalidateFixedFields, because SimpleTypeHandler doesn't support fixed fields at this point.
        for (int propertyIndex = 0; propertyIndex < this->propertyCount; propertyIndex++)
        {
            SetSlotUnchecked(instance, propertyIndex, CrossSite::MarshalVar(targetScriptContext, GetSlot(instance, propertyIndex)));
        }
    }